

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void line_attempt_3(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t y;
  int iVar6;
  size_t x;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  float fVar11;
  TGAColor local_48;
  float local_40;
  float local_3c;
  double local_38;
  
  local_48.bgra = color.bgra;
  uVar2 = x0 - x1;
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  local_48.bytespp = color.bytespp;
  uVar3 = y0 - y1;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  iVar6 = x1;
  iVar7 = y0;
  if (uVar1 < uVar2) {
    iVar6 = y1;
    iVar7 = x0;
    y1 = x1;
    x0 = y0;
  }
  iVar8 = y1;
  iVar9 = iVar6;
  iVar4 = x0;
  if (iVar6 < x0) {
    iVar8 = iVar7;
    iVar9 = x0;
    iVar4 = iVar6;
    iVar7 = y1;
  }
  local_3c = (float)(iVar9 - iVar4);
  local_38 = (double)iVar7;
  local_40 = (float)iVar8;
  if (iVar6 < x0) {
    x0 = iVar6;
  }
  for (sVar10 = (size_t)x0; (long)sVar10 <= (long)iVar9; sVar10 = sVar10 + 1) {
    fVar11 = (float)((int)sVar10 - x0) / local_3c;
    sVar5 = (size_t)(int)((double)(fVar11 * local_40) + (1.0 - (double)fVar11) * local_38);
    y = sVar5;
    x = sVar10;
    if (uVar1 < uVar2) {
      y = sVar10;
      x = sVar5;
    }
    TGAImage::set(image,x,y,&local_48);
  }
  return;
}

Assistant:

void line_attempt_3(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    bool steep = false;
    if (std::abs(x0 - x1) < std::abs(y0 - y1)) {  // if the line is steep, we transpose the image
        std::swap(x0, y0);
        std::swap(x1, y1);
        steep = true;
    }
    if (x0 > x1) {  // make it left−to−right
        std::swap(x0, x1);
        std::swap(y0, y1);
    }
    for (int x = x0; x <= x1; x++) {
        float t = static_cast<float>(x - x0) / static_cast<float>(x1 - x0);
        int y = static_cast<int>(y0 * (1. - t) + static_cast<float>(y1) * t);
        if (steep) {
            image.set(y, x, color);  // if transposed, de−transpose
        } else {
            image.set(x, y, color);
        }
    }
}